

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
MergeFrom(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  Rep *pRVar1;
  void **our_elems;
  int iVar2;
  
  iVar2 = (other->super_RepeatedPtrFieldBase).current_size_;
  if (iVar2 != 0) {
    pRVar1 = (other->super_RepeatedPtrFieldBase).rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&this->super_RepeatedPtrFieldBase,iVar2);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&this->super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar2,
               ((this->super_RepeatedPtrFieldBase).rep_)->allocated_size -
               (this->super_RepeatedPtrFieldBase).current_size_);
    iVar2 = iVar2 + (this->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).current_size_ = iVar2;
    pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
    if (pRVar1->allocated_size < iVar2) {
      pRVar1->allocated_size = iVar2;
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}